

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void print_statistics_csv(double *sketch_quantiles,double *exact_quantiles,int step)

{
  double dVar1;
  int p;
  ulong uVar2;
  double dVar3;
  
  dVar3 = 0.0;
  for (uVar2 = 0; uVar2 != 0x65; uVar2 = uVar2 + 1) {
    dVar1 = exact_quantiles[uVar2];
    if (dVar1 != 0.0) {
      dVar3 = dVar3 + ABS((sketch_quantiles[uVar2] - dVar1) / dVar1);
    }
    if ((int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) % (long)step)
        == 0) {
      printf("%.10f,");
    }
  }
  printf("%.10f,",dVar3 / 101.0);
  return;
}

Assistant:

void print_statistics_csv(double *sketch_quantiles, double *exact_quantiles, int step){
    double avg_re = 0.0;
    for (int p = 0; p < 101; p++) {
        double re = 0.0;
        if (fabs(exact_quantiles[p]) > 0) {
            re = fabs((sketch_quantiles[p] - exact_quantiles[p])) / fabs(exact_quantiles[p]);
            avg_re += re;
        }
        if (!(p % step)) {
            printf("%.10f,", re);
        }
    }
    printf("%.10f,", avg_re/101.0);
}